

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  size_t n;
  long lVar2;
  long lVar3;
  uint uVar5;
  long lVar4;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  timeval tv;
  int arr [200];
  timeval local_348;
  uint auStack_338 [202];
  
  lVar2 = 0;
  gettimeofday(&local_348,(__timezone_ptr_t)0x0);
  srand((uint)local_348.tv_sec);
  do {
    iVar1 = rand();
    auStack_338[lVar2] = iVar1 % 0x15;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 200);
  uVar6 = 0x7fffffff;
  uVar7 = 0x7fffffff;
  uVar9 = 0x7fffffff;
  uVar5 = 0x7fffffff;
  lVar2 = 0;
  do {
    uVar8 = -(uint)((int)auStack_338[lVar2] < (int)uVar6);
    uVar12 = -(uint)((int)auStack_338[lVar2 + 1] < (int)uVar7);
    uVar13 = -(uint)((int)auStack_338[lVar2 + 2] < (int)uVar9);
    uVar14 = -(uint)((int)auStack_338[lVar2 + 3] < (int)uVar5);
    uVar6 = ~uVar8 & uVar6 | auStack_338[lVar2] & uVar8;
    uVar7 = ~uVar12 & uVar7 | auStack_338[lVar2 + 1] & uVar12;
    uVar9 = ~uVar13 & uVar9 | auStack_338[lVar2 + 2] & uVar13;
    uVar5 = ~uVar14 & uVar5 | auStack_338[lVar2 + 3] & uVar14;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 200);
  uVar9 = ~-(uint)((int)uVar6 < (int)uVar9) & uVar9 | uVar6 & -(uint)((int)uVar6 < (int)uVar9);
  uVar7 = ~-(uint)((int)uVar7 < (int)uVar5) & uVar5 | uVar7 & -(uint)((int)uVar7 < (int)uVar5);
  uVar6 = -(uint)((int)uVar9 < (int)uVar7);
  uVar6 = ~uVar6 & uVar7 | uVar9 & uVar6;
  uVar7 = 0x80000000;
  uVar9 = 0x80000000;
  uVar5 = 0x80000000;
  uVar8 = 0x80000000;
  lVar2 = 0;
  do {
    uVar12 = -(uint)((int)uVar7 < (int)auStack_338[lVar2]);
    uVar13 = -(uint)((int)uVar9 < (int)auStack_338[lVar2 + 1]);
    uVar14 = -(uint)((int)uVar5 < (int)auStack_338[lVar2 + 2]);
    uVar15 = -(uint)((int)uVar8 < (int)auStack_338[lVar2 + 3]);
    uVar7 = ~uVar12 & uVar7 | auStack_338[lVar2] & uVar12;
    uVar9 = ~uVar13 & uVar9 | auStack_338[lVar2 + 1] & uVar13;
    uVar5 = ~uVar14 & uVar5 | auStack_338[lVar2 + 2] & uVar14;
    uVar8 = ~uVar15 & uVar8 | auStack_338[lVar2 + 3] & uVar15;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 200);
  uVar5 = ~-(uint)((int)uVar5 < (int)uVar7) & uVar5 | uVar7 & -(uint)((int)uVar5 < (int)uVar7);
  uVar9 = ~-(uint)((int)uVar8 < (int)uVar9) & uVar8 | uVar9 & -(uint)((int)uVar8 < (int)uVar9);
  uVar7 = -(uint)((int)uVar9 < (int)uVar5);
  uVar7 = ~uVar7 & uVar9 | uVar5 & uVar7;
  lVar3 = 0;
  lVar4 = 0;
  lVar2 = 0;
  do {
    auVar10._0_4_ = -(uint)((uint)*(undefined8 *)(auStack_338 + lVar2) == uVar6);
    auVar10._4_4_ = -(uint)((uint)((ulong)*(undefined8 *)(auStack_338 + lVar2) >> 0x20) == uVar6);
    auVar10._8_4_ = auVar10._4_4_;
    auVar10._12_4_ = 0xffffffff;
    lVar3 = lVar3 + SUB168(auVar10 & _DAT_00102030,0);
    lVar4 = lVar4 + SUB168(auVar10 & _DAT_00102030,8);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 200);
  lVar2 = 0;
  printf("The minimum is %d and it occurs %zu times.\n",(ulong)uVar6,lVar4 + lVar3);
  lVar3 = 0;
  lVar4 = 0;
  do {
    auVar11._0_4_ = -(uint)((uint)*(undefined8 *)(auStack_338 + lVar2) == uVar7);
    auVar11._4_4_ = -(uint)((uint)((ulong)*(undefined8 *)(auStack_338 + lVar2) >> 0x20) == uVar7);
    auVar11._8_4_ = auVar11._4_4_;
    auVar11._12_4_ = 0xffffffff;
    lVar3 = lVar3 + SUB168(auVar11 & _DAT_00102030,0);
    lVar4 = lVar4 + SUB168(auVar11 & _DAT_00102030,8);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 200);
  printf("The maximum is %d and it occurs %zu times.\n",(ulong)uVar7,lVar4 + lVar3);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  struct timeval tv;
  gettimeofday(&tv, NULL);

  int arr[ARR_LEN];
  srand((unsigned int)tv.tv_sec);
  for (size_t n = 0; n < ARR_LEN; n++) {
    arr[n] = rand() % 21;
  }

  int min = minimum(arr, ARR_LEN);
  int max = maximum(arr, ARR_LEN);
  printf("The minimum is %d and it occurs %zu times.\n", min, n_occurences(arr, ARR_LEN, min));
  printf("The maximum is %d and it occurs %zu times.\n", max, n_occurences(arr, ARR_LEN, max));

  return 0;
}